

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O0

function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *
TasDREAM::getSpecifiedDomain
          (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>
           *__return_storage_ptr__,int num_dimensions,void *domain_grid,double *domain_lower,
          double *domain_upper,tsg_dream_domain domain_callback)

{
  double *__last;
  tsg_dream_domain __first;
  anon_class_8_1_34167b40 local_90;
  allocator<double> local_81;
  vector<double,_std::allocator<double>_> local_80;
  allocator<double> local_51;
  vector<double,_std::allocator<double>_> local_50;
  tsg_dream_domain local_38;
  tsg_dream_domain domain_callback_local;
  double *domain_upper_local;
  double *domain_lower_local;
  void *domain_grid_local;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *pfStack_10;
  int num_dimensions_local;
  
  local_38 = domain_callback;
  domain_callback_local = (tsg_dream_domain)domain_upper;
  domain_upper_local = domain_lower;
  domain_lower_local = (double *)domain_grid;
  domain_grid_local._4_4_ = num_dimensions;
  pfStack_10 = __return_storage_ptr__;
  if (domain_grid == (void *)0x0) {
    if (domain_upper == (double *)0x0) {
      local_90.domain_callback = domain_callback;
      std::function<bool(std::vector<double,std::allocator<double>>const&)>::
      function<TasDREAM::getSpecifiedDomain(int,void*,double*,double*,int(*)(int,double_const*))::__0,void>
                ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                 __return_storage_ptr__,&local_90);
    }
    else {
      std::allocator<double>::allocator(&local_51);
      std::vector<double,std::allocator<double>>::vector<double*,void>
                ((vector<double,std::allocator<double>> *)&local_50,domain_lower,
                 domain_lower + num_dimensions,&local_51);
      __first = domain_callback_local;
      __last = (double *)(domain_callback_local + (long)domain_grid_local._4_4_ * 8);
      std::allocator<double>::allocator(&local_81);
      std::vector<double,std::allocator<double>>::vector<double*,void>
                ((vector<double,std::allocator<double>> *)&local_80,(double *)__first,__last,
                 &local_81);
      hypercube(__return_storage_ptr__,&local_50,&local_80);
      std::vector<double,_std::allocator<double>_>::~vector(&local_80);
      std::allocator<double>::~allocator(&local_81);
      std::vector<double,_std::allocator<double>_>::~vector(&local_50);
      std::allocator<double>::~allocator(&local_51);
    }
  }
  else {
    TasGrid::TasmanianSparseGrid::getDomainInside
              (__return_storage_ptr__,(TasmanianSparseGrid *)domain_grid);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(const std::vector<double> &x)>
getSpecifiedDomain(int num_dimensions, void *domain_grid, double *domain_lower, double *domain_upper, tsg_dream_domain domain_callback){
    if (domain_grid != nullptr){
        return reinterpret_cast<TasGrid::TasmanianSparseGrid*>(domain_grid)->getDomainInside();
    }else if (domain_upper != nullptr){
        return hypercube(std::vector<double>(domain_lower, domain_lower + num_dimensions),
                         std::vector<double>(domain_upper, domain_upper + num_dimensions));
    }else{
        return [=](std::vector<double> const &x)->
        bool{
            return (domain_callback((int) x.size(), x.data()) != 0);
        };
    }
}